

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
common_sampler_sample_and_accept_n
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,common_sampler *gsmpl,
          llama_context *ctx,llama_tokens *draft,bool grammar_first)

{
  ulong uVar1;
  vector<int,_std::allocator<int>_> idxs;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             ((long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 1,&local_49);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar1] = (int)uVar1;
  }
  common_sampler_sample_and_accept_n
            (__return_storage_ptr__,gsmpl,ctx,(vector<int,_std::allocator<int>_> *)&local_48,draft,
             grammar_first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<llama_token> common_sampler_sample_and_accept_n(struct common_sampler * gsmpl, struct llama_context * ctx, const llama_tokens & draft, bool grammar_first) {
    std::vector<int> idxs(draft.size() + 1);
    for (size_t i = 0; i < idxs.size(); ++i) {
        idxs[i] = i;
    }

    return common_sampler_sample_and_accept_n(gsmpl, ctx, idxs, draft, grammar_first);
}